

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *os,texcoord2h *v)

{
  float fVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  fVar1 = tinyusdz::value::half_to_float((half)(v->s).value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)(v->t).value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const tinyusdz::value::texcoord2h &v) {
  os << "(" << v.s << ", " << v.t << ")";
  return os;
}